

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-rasterize.c
# Opt level: O0

void plutovg_span_buffer_copy(plutovg_span_buffer_t *span_buffer,plutovg_span_buffer_t *source)

{
  plutovg_span_t *ppVar1;
  int local_24;
  int local_20;
  int newcapacity;
  int capacity;
  plutovg_span_buffer_t *source_local;
  plutovg_span_buffer_t *span_buffer_local;
  
  (span_buffer->spans).size = 0;
  if (((source->spans).data != (plutovg_span_t *)0x0) && (0 < (source->spans).size)) {
    if ((span_buffer->spans).capacity < (span_buffer->spans).size + (source->spans).size) {
      if ((span_buffer->spans).capacity == 0) {
        local_24 = 8;
      }
      else {
        local_24 = (span_buffer->spans).capacity;
      }
      for (local_20 = local_24; local_20 < (span_buffer->spans).size + (source->spans).size;
          local_20 = local_20 << 1) {
      }
      ppVar1 = (plutovg_span_t *)realloc((span_buffer->spans).data,(long)local_20 << 4);
      (span_buffer->spans).data = ppVar1;
      (span_buffer->spans).capacity = local_20;
    }
    memcpy((span_buffer->spans).data + (span_buffer->spans).size,(source->spans).data,
           (long)(source->spans).size << 4);
    (span_buffer->spans).size = (source->spans).size + (span_buffer->spans).size;
  }
  span_buffer->x = source->x;
  span_buffer->y = source->y;
  span_buffer->w = source->w;
  span_buffer->h = source->h;
  return;
}

Assistant:

void plutovg_span_buffer_copy(plutovg_span_buffer_t* span_buffer, const plutovg_span_buffer_t* source)
{
    plutovg_array_clear(span_buffer->spans);
    plutovg_array_append(span_buffer->spans, source->spans);
    span_buffer->x = source->x;
    span_buffer->y = source->y;
    span_buffer->w = source->w;
    span_buffer->h = source->h;
}